

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O0

void __thiscall
asio::detail::posix_thread::posix_thread<asio::detail::scheduler::thread_function>
          (posix_thread *this,thread_function f,uint param_3)

{
  thread_function in_RDI;
  func<asio::detail::scheduler::thread_function> *in_stack_ffffffffffffffb8;
  func_base *in_stack_ffffffffffffffd8;
  posix_thread *in_stack_ffffffffffffffe0;
  
  noncopyable::noncopyable((noncopyable *)in_RDI.this_);
  *(undefined1 *)
   &((in_RDI.this_)->super_execution_context_service_base<asio::detail::scheduler>).super_service.
    key_.type_info_ = 0;
  operator_new(0x10);
  func<asio::detail::scheduler::thread_function>::func(in_stack_ffffffffffffffb8,in_RDI);
  start_thread(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

posix_thread(Function f, unsigned int = 0)
    : joined_(false)
  {
    start_thread(new func<Function>(f));
  }